

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlSaveFileTo(xmlOutputBufferPtr buf,xmlDocPtr cur,char *encoding)

{
  undefined1 local_c8 [4];
  int ret;
  xmlSaveCtxt ctxt;
  char *encoding_local;
  xmlDocPtr cur_local;
  xmlOutputBufferPtr buf_local;
  
  if (buf == (xmlOutputBufferPtr)0x0) {
    buf_local._4_4_ = -1;
  }
  else {
    ctxt._152_8_ = encoding;
    if (cur == (xmlDocPtr)0x0) {
      xmlOutputBufferClose(buf);
      buf_local._4_4_ = -1;
    }
    else {
      memset(local_c8,0,0xa0);
      ctxt.buf._4_4_ = 0;
      ctxt.options = 0;
      ctxt.filename = (xmlChar *)ctxt._152_8_;
      ctxt.handler = (xmlCharEncodingHandlerPtr)buf;
      xmlSaveCtxtInit((xmlSaveCtxtPtr)local_c8);
      ctxt.buf._0_4_ = (uint)ctxt.buf | 0x20;
      xmlDocContentDumpOutput((xmlSaveCtxtPtr)local_c8,cur);
      buf_local._4_4_ = xmlOutputBufferClose(buf);
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlSaveFileTo(xmlOutputBufferPtr buf, xmlDocPtr cur, const char *encoding) {
    xmlSaveCtxt ctxt;
    int ret;

    if (buf == NULL) return(-1);
    if (cur == NULL) {
        xmlOutputBufferClose(buf);
	return(-1);
    }
    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = 0;
    ctxt.format = 0;
    ctxt.encoding = (const xmlChar *) encoding;
    xmlSaveCtxtInit(&ctxt);
    ctxt.options |= XML_SAVE_AS_XML;
    xmlDocContentDumpOutput(&ctxt, cur);
    ret = xmlOutputBufferClose(buf);
    return(ret);
}